

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

int __thiscall xmrig::Client::connect(Client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 *puVar1;
  void *pvVar2;
  uv_tcp_t *puVar3;
  undefined8 uVar4;
  Client *extraout_RAX;
  Client *this_00;
  undefined4 in_register_00000034;
  uv_connect_t *req;
  undefined8 in_stack_ffffffffffffffe8;
  
  this_00 = (Client *)CONCAT44(in_register_00000034,__fd);
  setState(this_00,(SocketState)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  puVar1 = (undefined8 *)operator_new(0x60);
  pvVar2 = Storage<xmrig::Client>::ptr(this->m_key);
  *puVar1 = pvVar2;
  puVar3 = (uv_tcp_t *)operator_new(0xf8);
  this->m_socket = puVar3;
  pvVar2 = Storage<xmrig::Client>::ptr(this->m_key);
  this->m_socket->data = pvVar2;
  uVar4 = uv_default_loop();
  uv_tcp_init(uVar4,this->m_socket);
  uv_tcp_nodelay(this->m_socket,1);
  uv_tcp_keepalive(this->m_socket,1,0x3c);
  uv_tcp_connect(puVar1,this->m_socket,this_00,onConnect);
  if (this_00 != (Client *)0x0) {
    operator_delete(this_00);
    this_00 = extraout_RAX;
  }
  return (int)this_00;
}

Assistant:

void xmrig::Client::connect(sockaddr *addr)
{
    setState(ConnectingState);

    uv_connect_t *req = new uv_connect_t;
    req->data = m_storage.ptr(m_key);

    m_socket = new uv_tcp_t;
    m_socket->data = m_storage.ptr(m_key);

    uv_tcp_init(uv_default_loop(), m_socket);
    uv_tcp_nodelay(m_socket, 1);

#   ifndef WIN32
    uv_tcp_keepalive(m_socket, 1, 60);
#   endif

    uv_tcp_connect(req, m_socket, addr, onConnect);

    delete addr;
}